

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_coin.cpp
# Opt level: O3

void __thiscall
cfdcapi_coin_EstimateFeeBySchnorr_Test::TestBody(cfdcapi_coin_EstimateFeeBySchnorr_Test *this)

{
  void *handle_00;
  void *fee_handle_00;
  bool bVar1;
  int iVar2;
  pointer pUVar3;
  char *pcVar4;
  Script *locking_script;
  Amount AVar5;
  initializer_list<cfd::UtxoData> __l;
  allocator_type local_ad9;
  pointer local_ad8;
  Script local_ad0;
  int64_t tx_fee;
  int64_t utxo_fee;
  ConfidentialAssetId local_a28;
  int ret;
  undefined4 uStack_9fc;
  pointer local_9f8;
  string local_9d8;
  string local_9b8;
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  Amount local_900;
  Txid local_8f0;
  BlockHash local_8d0;
  BlindFactor local_8b0;
  BlindFactor local_890;
  AddressFactory factory;
  AssertionResult gtest_ar;
  undefined1 local_838 [1248];
  void *handle;
  _Alloc_hider local_348;
  char local_338 [16];
  pointer local_328;
  pointer local_310;
  pointer local_2f8;
  TapBranch local_2e0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_268;
  Script local_250;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_210;
  void *fee_handle;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8 [53];
  
  cfd::AddressFactory::AddressFactory(&factory);
  local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_938,"590ba2283fbe5fb9363c74417bc1cb3f76d4df9d31890f9124b9e1706136b4f4"
             ,"");
  cfd::core::BlockHash::BlockHash(&local_8d0,&local_938);
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_958,"2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916"
             ,"");
  cfd::core::Txid::Txid(&local_8f0,&local_958);
  local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_978,
             "51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb","");
  cfd::core::Script::Script((Script *)&tx_fee,&local_978);
  local_998._M_dataplus._M_p = (pointer)&local_998.field_2;
  local_ad8 = (pointer)0x6169ca;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_998,"");
  cfd::core::Script::Script((Script *)&utxo_fee,&local_998);
  local_9b8._M_dataplus._M_p = (pointer)&local_9b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9b8,"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4",
             "");
  cfd::AddressFactory::GetAddress((Address *)&handle,&factory,&local_9b8);
  local_9d8._M_dataplus._M_p = (pointer)&local_9d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_9d8,
             "raw(51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb)","");
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(0x9502f518);
  local_900.amount_ = AVar5.amount_;
  local_900.ignore_check_ = AVar5.ignore_check_;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_a28);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&fee_handle);
  cfd::core::BlindFactor::BlindFactor(&local_890);
  cfd::core::BlindFactor::BlindFactor(&local_8b0);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&ret);
  cfd::core::Script::Script(&local_ad0);
  locking_script = (Script *)&tx_fee;
  cfd::UtxoData::UtxoData
            ((UtxoData *)&gtest_ar,0xc,&local_8d0,&local_8f0,0,locking_script,(Script *)&utxo_fee,
             (Address *)&handle,&local_9d8,&local_900,kTaprootAddress,(void *)0x0,&local_a28,
             (ElementsConfidentialAddress *)&fee_handle,&local_890,&local_8b0,
             (ConfidentialValue *)&ret,&local_ad0);
  __l._M_len = 1;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector(&utxos,__l,&local_ad9);
  cfd::UtxoData::~UtxoData((UtxoData *)&gtest_ar);
  cfd::core::Script::~Script(&local_ad0);
  _ret = &PTR__ConfidentialValue_00723840;
  if (local_9f8 != (pointer)0x0) {
    operator_delete(local_9f8);
  }
  local_8b0._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_00723500;
  if (local_8b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_8b0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_890._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_00723500;
  if (local_890.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_890.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&fee_handle);
  local_a28._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00723760;
  if (local_a28.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a28.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8._M_dataplus._M_p != &local_9d8.field_2) {
    operator_delete(local_9d8._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_210);
  cfd::core::Script::~Script(&local_250);
  local_2e0._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_268);
  cfd::core::TapBranch::~TapBranch(&local_2e0);
  if (local_2f8 != (pointer)0x0) {
    operator_delete(local_2f8);
  }
  if (local_310 != (pointer)0x0) {
    operator_delete(local_310);
  }
  if (local_328 != (pointer)0x0) {
    operator_delete(local_328);
  }
  if (local_348._M_p != local_338) {
    operator_delete(local_348._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
    operator_delete(local_9b8._M_dataplus._M_p);
  }
  cfd::core::Script::~Script((Script *)&utxo_fee);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998._M_dataplus._M_p != &local_998.field_2) {
    operator_delete(local_998._M_dataplus._M_p);
  }
  cfd::core::Script::~Script((Script *)&tx_fee);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_978._M_dataplus._M_p != &local_978.field_2) {
    operator_delete(local_978._M_dataplus._M_p);
  }
  local_8f0._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
  if (local_8f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_8f0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p);
  }
  local_8d0._vptr_BlockHash = (_func_int **)&PTR__BlockHash_00723790;
  if (local_8d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_8d0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_938._M_dataplus._M_p != &local_938.field_2) {
    operator_delete(local_938._M_dataplus._M_p);
  }
  handle = (void *)0x0;
  iVar2 = CfdCreateHandle(&handle);
  _ret = (undefined **)CONCAT44(uStack_9fc,iVar2);
  fee_handle = (void *)((ulong)fee_handle._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&fee_handle,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&fee_handle);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      local_ad8 = (pointer)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&tx_fee,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0xc3,(char *)local_ad8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&tx_fee,(Message *)&fee_handle);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tx_fee);
    if (fee_handle != (void *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (fee_handle != (void *)0x0)) {
        (**(code **)(*fee_handle + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  fee_handle = (void *)CONCAT71(fee_handle._1_7_,handle != (void *)0x0);
  local_1d8[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&tx_fee);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&fee_handle,(AssertionResult *)"(NULL == handle)",
               "true","false",(char *)locking_script);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0xc4,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&utxo_fee,(Message *)&tx_fee);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee);
    if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_838) {
      operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    }
    if (tx_fee != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (tx_fee != 0)) {
        (**(code **)(*(long *)tx_fee + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_1d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  fee_handle = (void *)0x0;
  iVar2 = CfdInitializeEstimateFee(handle,&fee_handle,false);
  _ret = (undefined **)CONCAT44(uStack_9fc,iVar2);
  tx_fee = (ulong)tx_fee._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&tx_fee);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,200,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&utxo_fee,(Message *)&tx_fee);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee);
    if (tx_fee != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (tx_fee != 0)) {
        (**(code **)(*(long *)tx_fee + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (ret == 0) {
    local_ad8 = utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
                super__Vector_impl_data._M_finish;
    if (utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
        super__Vector_impl_data._M_start !=
        utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pUVar3 = utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        fee_handle_00 = fee_handle;
        handle_00 = handle;
        cfd::core::Txid::GetHex_abi_cxx11_((string *)&gtest_ar,&pUVar3->txid);
        iVar2 = CfdAddTxInputForEstimateFee
                          (handle_00,fee_handle_00,
                           (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),pUVar3->vout,
                           (pUVar3->descriptor)._M_dataplus._M_p,(char *)0x0,false,false,false,
                           (char *)0x0,0,0,(char *)0x0);
        _ret = (undefined **)CONCAT44(uStack_9fc,iVar2);
        if ((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != local_838) {
          operator_delete((undefined1 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        }
        tx_fee = tx_fee & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&tx_fee);
          pcVar4 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&utxo_fee,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                     ,0xd0,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&utxo_fee,(Message *)&tx_fee);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee);
          if (tx_fee != 0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && (tx_fee != 0)) {
              (**(code **)(*(long *)tx_fee + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pUVar3 = pUVar3 + 1;
      } while (pUVar3 != local_ad8);
    }
    iVar2 = CfdFinalizeEstimateFee
                      (handle,fee_handle,
                       "0200000000010116d975e4c2cea30f72f4f5fe528f5a0727d9ea149892a50c030d44423088ea2f0000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000"
                       ,(char *)0x0,&tx_fee,&utxo_fee,true,2.0);
    _ret = (undefined **)CONCAT44(uStack_9fc,iVar2);
    local_ad0._vptr_Script = (_func_int **)((ulong)local_ad0._vptr_Script._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_ad0,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_ad0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0xd6,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a28,(Message *)&local_ad0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a28);
      if (local_ad0._vptr_Script != (_func_int **)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_ad0._vptr_Script != (_func_int **)0x0)) {
          (**(code **)(*local_ad0._vptr_Script + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_ad0._vptr_Script = (_func_int **)&DAT_00000056;
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&gtest_ar,"static_cast<int64_t>(86)","tx_fee",(long *)&local_ad0,&tx_fee)
    ;
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_ad0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0xd7,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a28,(Message *)&local_ad0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a28);
      if (local_ad0._vptr_Script != (_func_int **)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_ad0._vptr_Script != (_func_int **)0x0)) {
          (**(code **)(*local_ad0._vptr_Script + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_ad0._vptr_Script = (_func_int **)&DAT_00000074;
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&gtest_ar,"static_cast<int64_t>(116)","utxo_fee",(long *)&local_ad0,
               &utxo_fee);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_ad0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0xd8,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a28,(Message *)&local_ad0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a28);
      if (local_ad0._vptr_Script != (_func_int **)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_ad0._vptr_Script != (_func_int **)0x0)) {
          (**(code **)(*local_ad0._vptr_Script + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar2 = CfdFreeEstimateFeeHandle(handle,fee_handle);
    _ret = (undefined **)CONCAT44(uStack_9fc,iVar2);
    local_ad0._vptr_Script = (_func_int **)((ulong)local_ad0._vptr_Script & 0xffffffff00000000);
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_ad0,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_ad0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a28,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0xdb,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a28,(Message *)&local_ad0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a28);
      if (local_ad0._vptr_Script != (_func_int **)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_ad0._vptr_Script != (_func_int **)0x0)) {
          (**(code **)(*local_ad0._vptr_Script + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  iVar2 = CfdGetLastErrorCode(handle);
  ret = iVar2;
  if (iVar2 != 0) {
    tx_fee = 0;
    ret = CfdGetLastErrorMessage(handle,(char **)&tx_fee);
    utxo_fee._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&utxo_fee,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&utxo_fee);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_ad0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0xe5,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_ad0,(Message *)&utxo_fee);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ad0);
      if (CONCAT44(utxo_fee._4_4_,(undefined4)utxo_fee) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT44(utxo_fee._4_4_,(undefined4)utxo_fee) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(utxo_fee._4_4_,(undefined4)utxo_fee) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar4 = "";
    testing::internal::CmpHelperSTREQ((internal *)&gtest_ar,"\"\"","str_buffer","",(char *)tx_fee);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&utxo_fee);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_ad0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
                 ,0xe6,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_ad0,(Message *)&utxo_fee);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_ad0);
      if (CONCAT44(utxo_fee._4_4_,(undefined4)utxo_fee) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)CONCAT44(utxo_fee._4_4_,(undefined4)utxo_fee) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(utxo_fee._4_4_,(undefined4)utxo_fee) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)tx_fee);
  }
  iVar2 = CfdFreeHandle(handle);
  _ret = (undefined **)CONCAT44(uStack_9fc,iVar2);
  tx_fee = tx_fee & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_fee,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&tx_fee);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&utxo_fee,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_coin.cpp"
               ,0xec,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&utxo_fee,(Message *)&tx_fee);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&utxo_fee);
    if (tx_fee != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (tx_fee != 0)) {
        (**(code **)(*(long *)tx_fee + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  factory._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&factory.prefix_list_);
  return;
}

Assistant:

TEST(cfdcapi_coin, EstimateFeeBySchnorr) {
  // FIXME 実装する
  AddressFactory factory;
  std::vector<UtxoData> utxos = {
    UtxoData{
      12,
      BlockHash("590ba2283fbe5fb9363c74417bc1cb3f76d4df9d31890f9124b9e1706136b4f4"),
      Txid("2fea883042440d030ca5929814ead927075a8f52fef5f4720fa3cec2e475d916"),
      0,
      Script("51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb"),
      Script(""),
      factory.GetAddress("bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4"),
      "raw(51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb)",
      Amount::CreateBySatoshiAmount(2499999000),
      AddressType::kTaprootAddress,
#ifndef CFD_DISABLE_ELEMENTS
      nullptr,
      ConfidentialAssetId(),
      ElementsConfidentialAddress(),
      BlindFactor(),
      BlindFactor(),
      ConfidentialValue(),
#else
      nullptr,
#endif  // CFD_DISABLE_ELEMENTS
      Script()
    }
  };

  // 1 output data
  static const char* const kTxData = "0200000000010116d975e4c2cea30f72f4f5fe528f5a0727d9ea149892a50c030d44423088ea2f0000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50000000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* fee_handle = nullptr;
  ret = CfdInitializeEstimateFee(handle, &fee_handle, false);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    for (auto& utxo : utxos) {
      ret = CfdAddTxInputForEstimateFee(
          handle, fee_handle, utxo.txid.GetHex().c_str(), utxo.vout,
          utxo.descriptor.c_str(), nullptr,
          false, false, false, nullptr, 0, 0, nullptr);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    int64_t tx_fee, utxo_fee;
    ret = CfdFinalizeEstimateFee(
        handle, fee_handle, kTxData, nullptr, &tx_fee, &utxo_fee, true, 2.0);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(static_cast<int64_t>(86), tx_fee);
    EXPECT_EQ(static_cast<int64_t>(116), utxo_fee);

    ret = CfdFreeEstimateFeeHandle(handle, fee_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  // exp: 0200000000010116d975e4c2cea30f72f4f5fe528f5a0727d9ea149892a50c030d44423088ea2f0000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d5014161f75636003a870b7a1685abae84eedf8c9527227ac70183c376f7b3a35b07ebcbea14749e58ce1a87565b035b2f3963baa5ae3ede95e89fd607ab7849f208720100000000
  // vsize: 100

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}